

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  value_type entryPointCommand;
  Snapshot originSnapshot;
  bool bVar1;
  cmState *this_00;
  reference ppcVar2;
  char *path;
  cmMakefile *pcVar3;
  cmGlobalGenerator *this_01;
  allocator local_e1;
  string local_e0;
  cmMakefile *local_b0;
  cmMakefile *subMf;
  Directory local_80;
  cmState *local_58;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_50;
  PositionType local_48;
  undefined1 local_40 [8];
  Snapshot newSnapshot;
  bool immediate_local;
  bool excludeFromAll_local;
  string *binPath_local;
  string *srcPath_local;
  cmMakefile *this_local;
  
  newSnapshot.Position.Position._6_1_ = immediate;
  newSnapshot.Position.Position._7_1_ = excludeFromAll;
  bVar1 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar1) {
    this_00 = GetState(this);
    local_48 = (this->StateSnapshot).Position.Position;
    local_58 = (this->StateSnapshot).State;
    pcStack_50 = (this->StateSnapshot).Position.Tree;
    ppcVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->ContextStack);
    entryPointCommand = *ppcVar2;
    ppcVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->ContextStack);
    originSnapshot.Position.Tree = pcStack_50;
    originSnapshot.State = local_58;
    originSnapshot.Position.Position = local_48;
    cmState::CreateBuildsystemDirectorySnapshot
              ((Snapshot *)local_40,this_00,originSnapshot,&entryPointCommand->Name,(*ppcVar2)->Line
              );
    cmState::Snapshot::GetDirectory(&local_80,(Snapshot *)local_40);
    cmState::Directory::SetCurrentSource(&local_80,srcPath);
    cmState::Snapshot::GetDirectory((Directory *)&subMf,(Snapshot *)local_40);
    cmState::Directory::SetCurrentBinary((Directory *)&subMf,binPath);
    path = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(path);
    pcVar3 = (cmMakefile *)operator_new(0x730);
    cmMakefile(pcVar3,this->GlobalGenerator,(Snapshot *)local_40);
    local_b0 = pcVar3;
    this_01 = GetGlobalGenerator(this);
    cmGlobalGenerator::AddMakefile(this_01,local_b0);
    pcVar3 = local_b0;
    if ((newSnapshot.Position.Position._7_1_ & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"EXCLUDE_FROM_ALL",&local_e1);
      SetProperty(pcVar3,&local_e0,"TRUE");
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    if ((newSnapshot.Position.Position._6_1_ & 1) == 0) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                (&this->UnConfiguredDirectories,&local_b0);
    }
    else {
      ConfigureSubDirectory(this,local_b0);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot,
                                           this->ContextStack.back()->Name,
                                           this->ContextStack.back()->Line);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath.c_str());

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}